

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O3

char * rapidjson::internal::dtoa(double value,char *buffer,int maxDecimalPlaces)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  DiyFp DVar6;
  DiyFp DVar7;
  int K;
  int length;
  DiyFp w_p;
  DiyFp w_m;
  DiyFp v;
  int local_98;
  int local_94;
  DiyFp local_90;
  DiyFp local_80;
  DiyFp local_70;
  DiyFp local_60;
  DiyFp local_50;
  DiyFp local_40;
  
  if ((value != 0.0) || (NAN(value))) {
    if (value < 0.0) {
      *buffer = '-';
      buffer = buffer + 1;
    }
    uVar2 = (uint)((ulong)value >> 0x34) & 0x7ff;
    local_40.f = ((ulong)value & 0xfffffffffffff) + 0x10000000000000;
    if (uVar2 == 0) {
      local_40.f = (ulong)value & 0xfffffffffffff;
    }
    local_40.e = -0x432;
    if (uVar2 != 0) {
      local_40.e = uVar2 - 0x433;
    }
    local_50.f = 0;
    local_50.e = 0;
    local_60.f = 0;
    local_60.e = 0;
    DiyFp::NormalizedBoundaries(&local_40,&local_50,&local_60);
    dVar1 = (double)(-0x3d - local_60.e) * 0.30102999566398114 + 347.0;
    iVar3 = (int)((uint)((double)(int)dVar1 < dVar1) + (int)dVar1) >> 3;
    uVar4 = (ulong)(iVar3 + 1);
    local_98 = 0x15c - (iVar3 * 8 + 8);
    local_70.f = *(uint64_t *)(GetCachedPowerByIndex(unsigned_long)::kCachedPowers_F + uVar4 * 8);
    local_70.e = (int)*(short *)(GetCachedPowerByIndex(unsigned_long)::kCachedPowers_E + uVar4 * 2);
    uVar4 = 0x3f;
    if (local_40.f != 0) {
      for (; local_40.f >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    local_90.f = local_40.f << ((byte)(uVar4 ^ 0x3f) & 0x3f);
    local_90.e = local_40.e - (int)(uVar4 ^ 0x3f);
    DVar6 = DiyFp::operator*(&local_90,&local_70);
    local_80.f = DVar6.f;
    local_80.e = DVar6.e;
    DVar6 = DiyFp::operator*(&local_60,&local_70);
    local_90.e = DVar6.e;
    DVar7 = DiyFp::operator*(&local_50,&local_70);
    local_90.f = DVar6.f - 1;
    DigitGen(&local_80,&local_90,(DVar6.f + ~DVar7.f) - 1,buffer,&local_94,&local_98);
    pcVar5 = Prettify(buffer,local_94,local_98,maxDecimalPlaces);
  }
  else {
    if ((long)value < 0) {
      *buffer = '-';
      buffer = buffer + 1;
    }
    buffer[0] = '0';
    buffer[1] = '.';
    buffer[2] = '0';
    pcVar5 = buffer + 3;
  }
  return pcVar5;
}

Assistant:

inline char* dtoa(double value, char* buffer, int maxDecimalPlaces = 324) {
    RAPIDJSON_ASSERT(maxDecimalPlaces >= 1);
    Double d(value);
    if (d.IsZero()) {
        if (d.Sign())
            *buffer++ = '-';     // -0.0, Issue #289
        buffer[0] = '0';
        buffer[1] = '.';
        buffer[2] = '0';
        return &buffer[3];
    }
    else {
        if (value < 0) {
            *buffer++ = '-';
            value = -value;
        }
        int length, K;
        Grisu2(value, buffer, &length, &K);
        return Prettify(buffer, length, K, maxDecimalPlaces);
    }
}